

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *curname,string *subname)

{
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ExcludesError *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_38 [44];
  ExitCodes exit_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  
  exit_code = (ExitCodes)((ulong)in_RSI >> 0x20);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffa8;
  msg = in_RDI;
  ::std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ::std::operator+(__lhs,in_RDI);
  ExcludesError(unaff_retaddr,msg,exit_code);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}